

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 VVar1;
  Vector2 *pVVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  size_t i_1;
  size_t i;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_88;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> local_70;
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> local_58;
  
  DependentQuantity::ensureHave
            (&(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity);
  DependentQuantity::ensureHave
            (&(this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.
              super_DependentQuantity);
  DependentQuantity::ensureHave(&(this->edgeDihedralAnglesQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::MeshData
            (&local_58,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::operator=
            (&this->facePrincipalCurvatureDirections,&local_58);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::~MeshData(&local_58);
  local_58.mesh = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  local_58.defaultValue.y = (double)(local_58.mesh)->nFacesFillCount;
  local_58.defaultValue.x = 0.0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            (&local_88,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_58);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            (&local_70,(RangeSetBase<geometrycentral::surface::FaceRangeF> *)&local_58);
  while (local_88.iCurr != local_70.iCurr) {
    pVVar2 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInFace.data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    dVar9 = 0.0;
    dVar10 = 0.0;
    bVar6 = true;
    uVar3 = ((local_88.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_88.iCurr];
    for (uVar5 = uVar3; (bVar6 || (uVar5 != uVar3));
        uVar5 = ((local_88.mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5]) {
      if ((local_88.mesh)->useImplicitTwinFlag == true) {
        uVar7 = uVar5 >> 1;
      }
      else {
        uVar7 = ((local_88.mesh)->heEdgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
      }
      dVar11 = 1.0 / (this->super_IntrinsicGeometryInterface).edgeLengths.data.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [uVar7];
      VVar1 = pVVar2[uVar5];
      auVar13._0_8_ = -pVVar2[uVar5].y;
      auVar13._8_8_ = 0x8000000000000000;
      auVar8 = vshufpd_avx((undefined1  [16])VVar1,(undefined1  [16])VVar1,1);
      auVar4 = vshufpd_avx((undefined1  [16])VVar1,auVar13,1);
      auVar14._0_8_ = auVar8._0_8_ * auVar4._0_8_;
      auVar14._8_8_ = auVar8._8_8_ * auVar4._8_8_;
      auVar8._8_8_ = pVVar2[uVar5].x;
      auVar8._0_8_ = pVVar2[uVar5].x;
      auVar8 = vfnmadd231pd_avx512vl(auVar14,(undefined1  [16])VVar1,auVar8);
      auVar12._0_8_ = dVar11 * auVar8._0_8_;
      auVar12._8_8_ = dVar11 * auVar8._8_8_;
      dVar11 = (this->edgeDihedralAngles).data.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               [uVar7];
      auVar4._8_8_ = dVar11;
      auVar4._0_8_ = dVar11;
      auVar8 = vmulpd_avx512vl(auVar12,auVar4);
      bVar6 = false;
      dVar9 = dVar9 + auVar8._0_8_;
      dVar10 = dVar10 + auVar8._8_8_;
    }
    pVVar2 = (this->facePrincipalCurvatureDirections).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data + local_88.iCurr;
    pVVar2->x = dVar9 * 0.25;
    pVVar2->y = dVar10 * 0.25;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&local_88);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInFaceQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  facePrincipalCurvatureDirections = FaceData<Vector2>(mesh);

  for (Face f : mesh.faces()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : f.adjacentHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInFace[he];
      principalDir += -vec * vec / len * alpha;
    }

    facePrincipalCurvatureDirections[f] = principalDir / 4;
  }
}